

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O3

char * deqp::egl::Image::CreateImageGLES2::getTargetName(EGLint target)

{
  switch(target) {
  case 0x30b1:
    return "tex2d";
  case 0x30b2:
    goto switchD_0023360d_caseD_30b2;
  case 0x30b3:
    return "cubemap_pos_x";
  case 0x30b4:
    return "cubemap_neg_x";
  case 0x30b5:
    return "cubemap_pos_y";
  case 0x30b6:
    return "cubemap_neg_y";
  case 0x30b7:
    return "cubemap_pos_z";
  case 0x30b8:
    return "cubemap_neg_z";
  case 0x30b9:
    return "renderbuffer";
  default:
    if (target == 0x3140) {
      return "android_native";
    }
switchD_0023360d_caseD_30b2:
    return "";
  }
}

Assistant:

static const char* getTargetName (EGLint target)
	{
		switch (target)
		{
			case EGL_GL_TEXTURE_2D_KHR:						return "tex2d";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR:	return "cubemap_pos_x";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR:	return "cubemap_neg_x";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR:	return "cubemap_pos_y";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR:	return "cubemap_neg_y";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR:	return "cubemap_pos_z";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR:	return "cubemap_neg_z";
			case EGL_GL_RENDERBUFFER_KHR:					return "renderbuffer";
			case EGL_NATIVE_BUFFER_ANDROID:					return "android_native";
			default:		DE_ASSERT(DE_FALSE);			return "";
		}
	}